

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_math_test_mult.cpp
# Opt level: O0

void mult_test(void)

{
  ostream *this;
  exception *err;
  
  mult_test_uint64_uint64();
  mult_test_uint64_uint32();
  mult_test_uint64_int64();
  mult_test_uint64_int32();
  mult_test_int64_uint64();
  mult_test_int64_uint32();
  mult_test_int64_int64();
  mult_test_int64_int32();
  mult_test_uint32_uint64();
  mult_test_uint32_uint32();
  mult_test_uint32_int64();
  mult_test_uint32_int32();
  mult_test_int32_uint64();
  mult_test_int32_uint32();
  mult_test_int32_int64();
  mult_test_int32_int32();
  this = std::operator<<((ostream *)&std::cout,"Multiplication tests completed");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void mult_test()
{
	try
	{
		mult_test_uint64_uint64();
		mult_test_uint64_uint32();
		mult_test_uint64_int64();
		mult_test_uint64_int32();

		mult_test_int64_uint64();
		mult_test_int64_uint32();
		mult_test_int64_int64();
		mult_test_int64_int32();

		mult_test_uint32_uint64();
		mult_test_uint32_uint32();
		mult_test_uint32_int64();
		mult_test_uint32_int32();

		mult_test_int32_uint64();
		mult_test_int32_uint32();
		mult_test_int32_int64();
		mult_test_int32_int32();

		std::cout << "Multiplication tests completed" << std::endl;
	}
	catch (std::exception& err)
	{
		std::cout << "Multiplication tests failed - " << err.what() << std::endl;
	}

	return;
}